

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O0

string * jsonify_abi_cxx11_(string *__return_storage_ptr__,string_view in_str)

{
  size_type sVar1;
  uchar *puVar2;
  to_chars_result tVar3;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  char *local_58;
  errc local_50;
  char local_46;
  char local_45;
  char local_44 [6];
  char buffer [2];
  uchar *end_ptr;
  uchar *ptr;
  string_view in_str_local;
  string *result;
  
  in_str_local._M_len = (size_t)in_str._M_str;
  ptr = (uchar *)in_str._M_len;
  in_str_local._M_str = (char *)__return_storage_ptr__;
  end_ptr = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::data
                               ((basic_string_view<char,_std::char_traits<char>_> *)&ptr);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&ptr);
  puVar2 = end_ptr + sVar1;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (; end_ptr < puVar2; end_ptr = end_ptr + 1) {
    if (*end_ptr == '\\') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,'\\');
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,'\\');
    }
    else if (*end_ptr == '\"') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,'\\');
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,'\"');
    }
    else if (*end_ptr < 0x20) {
      tVar3 = std::to_chars(&local_46,local_44,*end_ptr,0x10);
      local_58 = tVar3.ptr;
      local_50 = tVar3.ec;
      if (local_50 == 0) {
        local_68 = sv("\\u00",4);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,&local_68);
        if (*end_ptr < 0x10) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(__return_storage_ptr__,'0');
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(__return_storage_ptr__,local_46);
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(__return_storage_ptr__,local_46);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(__return_storage_ptr__,local_45);
        }
      }
    }
    else if ((*end_ptr & 0x80) == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,*end_ptr);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,*end_ptr);
      if ((*end_ptr & 0x40) != 0) {
        if ((*end_ptr & 0x20) != 0) {
          if ((*end_ptr & 0x10) != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=(__return_storage_ptr__,end_ptr[1]);
            end_ptr = end_ptr + 1;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(__return_storage_ptr__,end_ptr[1]);
          end_ptr = end_ptr + 1;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (__return_storage_ptr__,end_ptr[1]);
        end_ptr = end_ptr + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string jsonify(std::string_view in_str) {
	const unsigned char *ptr = reinterpret_cast<const unsigned char *>(in_str.data());
	const unsigned char *end_ptr = ptr + in_str.size();
	std::string result;

	while (ptr < end_ptr) {
		if (*ptr == '\\') { // backslash
			result += '\\';
			result += '\\';
		}
		else if (*ptr == '\"') { // quotation
			result += '\\';
			result += '\"';
		}
		else if (*ptr < 0x20) { // control characters
			char buffer[2]; // control codes are only ever going to be at most 2 characters
			if (std::to_chars(buffer, buffer + sizeof(buffer), *ptr, 16).ec == std::errc{}) {
				result += "\\u00"sv;
				if (*ptr > 0xF) {
					result += buffer[0];
					result += buffer[1];
				}
				else {
					result += '0';
					result += buffer[0];
				}
			};
		}
		else if ((*ptr & 0x80) != 0) { // UTF-8 sequence; copy to bypass above processing
			result += *ptr;
			if ((*ptr & 0x40) != 0) {
				// this is a 2+ byte sequence

				if ((*ptr & 0x20) != 0) {
					// this is a 3+ byte sequence

					if ((*ptr & 0x10) != 0) {
						// this is a 4 byte sequnce
						result += *++ptr;
					}

					result += *++ptr;
				}

				result += *++ptr;
			}
		}
		else { // Character in standard ASCII table
			result += *ptr;
		}

		++ptr;
	}

	return result;
}